

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Aggregate_State_PDU
          (Aggregate_State_PDU *this,AggregateIdentifier *AI,ForceID FID,AggregateState AS,
          AggregateType *AT,Formation F,AggregateMarking *AM,Vector *Dimensions,
          EulerAngles *Orientation,WorldCoordinates *CenterOfMass,Vector *Velocity)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  KFLOAT64 KVar4;
  KUINT16 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  KUINT8 KVar8;
  KUINT8 KVar9;
  KUINT8 KVar10;
  KCHAR8 KVar11;
  KCHAR8 KVar12;
  KCHAR8 KVar13;
  KCHAR8 KVar14;
  KCHAR8 KVar15;
  KCHAR8 KVar16;
  KCHAR8 KVar17;
  KFLOAT32 KVar18;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Aggregate_State_PDU_002218d8;
  (this->m_AggregateID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223f60;
  KVar5 = (AI->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_AggregateID).super_SimulationIdentifier.m_ui16SiteID =
       (AI->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_AggregateID).super_SimulationIdentifier.m_ui16ApplicationID = KVar5;
  (this->m_AggregateID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AggregateIdentifier_002242d8;
  *(undefined2 *)&(this->m_AggregateID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(AI->super_SimulationIdentifier).field_0xc;
  this->m_ui8ForceID = (KUINT8)FID;
  this->m_ui8AggState = (KUINT8)AS;
  (this->m_AggregateType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AggregateType_00224388;
  KVar6 = AT->m_ui8Domain;
  KVar5 = AT->m_ui16Country;
  KVar7 = AT->m_ui8Category;
  KVar8 = AT->m_ui8SubCategory;
  KVar9 = AT->m_ui8Specific;
  KVar10 = AT->m_ui8Extra;
  (this->m_AggregateType).m_ui8Kind = AT->m_ui8Kind;
  (this->m_AggregateType).m_ui8Domain = KVar6;
  (this->m_AggregateType).m_ui16Country = KVar5;
  (this->m_AggregateType).m_ui8Category = KVar7;
  (this->m_AggregateType).m_ui8SubCategory = KVar8;
  (this->m_AggregateType).m_ui8Specific = KVar9;
  (this->m_AggregateType).m_ui8Extra = KVar10;
  this->m_ui32Formation = F;
  (this->m_AggregateMarking).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224330;
  KVar11 = AM->m_sAggregateMarkingString[0];
  KVar12 = AM->m_sAggregateMarkingString[1];
  KVar13 = AM->m_sAggregateMarkingString[2];
  KVar14 = AM->m_sAggregateMarkingString[3];
  KVar15 = AM->m_sAggregateMarkingString[4];
  KVar16 = AM->m_sAggregateMarkingString[5];
  KVar17 = AM->m_sAggregateMarkingString[6];
  uVar1 = *(undefined8 *)(AM->m_sAggregateMarkingString + 7);
  uVar2 = *(undefined8 *)(AM->m_sAggregateMarkingString + 0xf);
  uVar3 = *(undefined8 *)(AM->m_sAggregateMarkingString + 0x17);
  (this->m_AggregateMarking).m_ui8AggregateMarkingCharacterSet =
       AM->m_ui8AggregateMarkingCharacterSet;
  (this->m_AggregateMarking).m_sAggregateMarkingString[0] = KVar11;
  (this->m_AggregateMarking).m_sAggregateMarkingString[1] = KVar12;
  (this->m_AggregateMarking).m_sAggregateMarkingString[2] = KVar13;
  (this->m_AggregateMarking).m_sAggregateMarkingString[3] = KVar14;
  (this->m_AggregateMarking).m_sAggregateMarkingString[4] = KVar15;
  (this->m_AggregateMarking).m_sAggregateMarkingString[5] = KVar16;
  (this->m_AggregateMarking).m_sAggregateMarkingString[6] = KVar17;
  *(undefined8 *)((this->m_AggregateMarking).m_sAggregateMarkingString + 7) = uVar1;
  *(undefined8 *)((this->m_AggregateMarking).m_sAggregateMarkingString + 0xf) = uVar2;
  *(undefined8 *)((this->m_AggregateMarking).m_sAggregateMarkingString + 0x17) = uVar3;
  (this->m_AggregateMarking).m_sAggregateMarkingString[0x1f] = AM->m_sAggregateMarkingString[0x1f];
  (this->m_Dimensions).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar18 = Dimensions->m_f32Y;
  (this->m_Dimensions).m_f32X = Dimensions->m_f32X;
  (this->m_Dimensions).m_f32Y = KVar18;
  (this->m_Dimensions).m_f32Z = Dimensions->m_f32Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00223d08;
  KVar18 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar18;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  (this->m_CtrOfMassLoc).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00224228;
  KVar4 = CenterOfMass->m_f64Y;
  (this->m_CtrOfMassLoc).m_f64X = CenterOfMass->m_f64X;
  (this->m_CtrOfMassLoc).m_f64Y = KVar4;
  (this->m_CtrOfMassLoc).m_f64Z = CenterOfMass->m_f64Z;
  (this->m_Vel).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002241d0;
  (this->m_Vel).m_f32Z = Velocity->m_f32Z;
  KVar18 = Velocity->m_f32Y;
  (this->m_Vel).m_f32X = Velocity->m_f32X;
  (this->m_Vel).m_f32Y = KVar18;
  this->m_ui16Padding1 = 0;
  this->m_ui16NumberOfPaddingOctets = 0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVD).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ui16NumAggregates = 0;
  this->m_ui16NumEntities = 0;
  this->m_ui16NumSilentAggregateTypes = 0;
  this->m_ui16NumSilentEntityTypes = 0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vAI).
  super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vEI).
  super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this->m_ui32NumVariableDatum = 0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSESL).
  super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSASL).
  super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '!';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x88;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Aggregate_State_PDU::Aggregate_State_PDU( const AggregateIdentifier & AI, ForceID FID, AggregateState AS,
        const AggregateType & AT, Formation F, const AggregateMarking & AM,
        const Vector & Dimensions, const EulerAngles & Orientation,
        const WorldCoordinates & CenterOfMass, const Vector & Velocity ) :
    m_AggregateID( AI ),
    m_ui8ForceID( FID ),
    m_ui8AggState( AS ),
    m_AggregateType( AT ),
    m_ui32Formation( F ),
    m_AggregateMarking( AM ),
    m_Dimensions( Dimensions ),
    m_Ori( Orientation ),
    m_CtrOfMassLoc( CenterOfMass ),
    m_Vel( Velocity ),
    m_ui16NumAggregates( 0 ),
    m_ui16NumEntities( 0 ),
    m_ui16NumSilentAggregateTypes( 0 ),
    m_ui16NumSilentEntityTypes( 0 ),
    m_bNeedsPadding( false ),
    m_ui16Padding1( 0 ),
    m_ui16NumberOfPaddingOctets( 0 ),
    m_ui32NumVariableDatum( 0 )
{
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = AggregateState_PDU_Type;
    m_ui16PDULength = AGGREGATE_STATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}